

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O1

void __thiscall Assimp::Vertex::SortBack(Vertex *this,aiMesh *out,uint idx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  ulong uVar4;
  undefined8 uVar5;
  float fVar6;
  aiVector3D *paVar7;
  uint i;
  long lVar8;
  
  if (out->mNumVertices <= idx) {
    __assert_fail("idx<out->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/Vertex.h"
                  ,0xb5,"void Assimp::Vertex::SortBack(aiMesh *, unsigned int) const");
  }
  paVar7 = out->mVertices;
  uVar4 = (ulong)idx;
  paVar7[uVar4].z = (this->position).z;
  fVar6 = (this->position).y;
  paVar7 = paVar7 + uVar4;
  paVar7->x = (this->position).x;
  paVar7->y = fVar6;
  paVar7 = out->mNormals;
  if ((paVar7 != (aiVector3D *)0x0) && (out->mNumVertices != 0)) {
    paVar7[uVar4].z = (this->normal).z;
    fVar6 = (this->normal).y;
    paVar7[uVar4].x = (this->normal).x;
    paVar7[uVar4].y = fVar6;
  }
  paVar7 = out->mTangents;
  if (((paVar7 != (aiVector3D *)0x0) && (out->mBitangents != (aiVector3D *)0x0)) &&
     (out->mNumVertices != 0)) {
    paVar7[uVar4].z = (this->tangent).z;
    fVar6 = (this->tangent).y;
    paVar7[uVar4].x = (this->tangent).x;
    paVar7[uVar4].y = fVar6;
    paVar7 = out->mBitangents;
    paVar7[uVar4].z = (this->bitangent).z;
    fVar6 = (this->bitangent).y;
    paVar7 = paVar7 + uVar4;
    paVar7->x = (this->bitangent).x;
    paVar7->y = fVar6;
  }
  paVar7 = this->texcoords;
  lVar8 = 0;
  do {
    if ((out->mTextureCoords[lVar8] == (aiVector3D *)0x0) || (out->mNumVertices == 0)) break;
    paVar3 = out->mTextureCoords[lVar8];
    paVar3[uVar4].z = paVar7->z;
    fVar6 = paVar7->y;
    paVar3 = paVar3 + uVar4;
    paVar3->x = paVar7->x;
    paVar3->y = fVar6;
    lVar8 = lVar8 + 1;
    paVar7 = paVar7 + 1;
  } while (lVar8 != 8);
  lVar8 = 0;
  while( true ) {
    if (*(long *)((long)out->mColors + lVar8) == 0) {
      return;
    }
    if (out->mNumVertices == 0) break;
    puVar1 = (undefined8 *)((long)&this->colors[0].r + lVar8 * 2);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)(*(long *)((long)out->mColors + lVar8) + uVar4 * 0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar8 = lVar8 + 8;
    if (lVar8 == 0x40) {
      return;
    }
  }
  return;
}

Assistant:

void SortBack(aiMesh* out, unsigned int idx) const {
        ai_assert(idx<out->mNumVertices);
        out->mVertices[idx] = position;

        if (out->HasNormals()) {
            out->mNormals[idx] = normal;
        }

        if (out->HasTangentsAndBitangents()) {
            out->mTangents[idx] = tangent;
            out->mBitangents[idx] = bitangent;
        }

        for(unsigned int i = 0; out->HasTextureCoords(i); ++i) {
            out->mTextureCoords[i][idx] = texcoords[i];
        }

        for(unsigned int i = 0; out->HasVertexColors(i); ++i) {
            out->mColors[i][idx] = colors[i];
        }
    }